

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassert.cpp
# Opt level: O2

void qt_check_pointer(char *n,int l)

{
  fputs("Out of memory",_stderr);
  fprintf(_stderr,"  in %s, line %d\n",n,l);
  std::terminate();
}

Assistant:

void qt_check_pointer(const char *n, int l) noexcept
{
    // make separate printing calls so that the first one may flush;
    // the second one could want to allocate memory (fputs prints a
    // newline and stderr auto-flushes).
    fputs("Out of memory", stderr);
    fprintf(stderr, "  in %s, line %d\n", n, l);

    std::terminate();
}